

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void InitMarshalData(SstStream Stream)

{
  undefined8 *puVar1;
  undefined4 *__s;
  void *pvVar2;
  undefined8 uVar3;
  long in_RDI;
  FFSMetadataInfoStruct *MBase;
  FFSWriterMarshalBase *Info;
  int *in_stack_00000018;
  FMFieldList *in_stack_00000020;
  
  __s = (undefined4 *)malloc(0x78);
  memset(__s,0,0x78);
  *(undefined4 **)(in_RDI + 0x1c0) = __s;
  *__s = 0;
  pvVar2 = malloc(0x28);
  *(void **)(__s + 2) = pvVar2;
  __s[6] = 0;
  *(undefined8 *)(__s + 8) = 0;
  __s[0xc] = 0;
  *(undefined8 *)(__s + 0xe) = 0;
  uVar3 = create_local_FMcontext();
  *(undefined8 *)(__s + 4) = uVar3;
  AddSimpleField(in_stack_00000020,in_stack_00000018,(char *)Stream,(char *)Info,MBase._4_4_);
  AddSimpleField(in_stack_00000020,in_stack_00000018,(char *)Stream,(char *)Info,MBase._4_4_);
  AddSimpleField(in_stack_00000020,in_stack_00000018,(char *)Stream,(char *)Info,MBase._4_4_);
  RecalcMarshalStorageSize(Stream);
  puVar1 = *(undefined8 **)(in_RDI + 0x1d0);
  *puVar1 = 0;
  pvVar2 = malloc(8);
  puVar1[1] = pvVar2;
  puVar1[2] = 0;
  return;
}

Assistant:

static void InitMarshalData(SstStream Stream)
{
    struct FFSWriterMarshalBase *Info = malloc(sizeof(struct FFSWriterMarshalBase));
    struct FFSMetadataInfoStruct *MBase;

    memset(Info, 0, sizeof(*Info));
    Stream->WriterMarshalData = Info;
    Info->RecCount = 0;
    Info->RecList = malloc(sizeof(Info->RecList[0]));
    Info->MetaFieldCount = 0;
    Info->MetaFields = NULL;
    Info->DataFieldCount = 0;
    Info->DataFields = NULL;
    Info->LocalFMContext = create_local_FMcontext();
    AddSimpleField(&Info->MetaFields, &Info->MetaFieldCount, "BitFieldCount", "integer",
                   sizeof(size_t));
    AddSimpleField(&Info->MetaFields, &Info->MetaFieldCount, "BitField", "integer[BitFieldCount]",
                   sizeof(size_t));
    AddSimpleField(&Info->MetaFields, &Info->MetaFieldCount, "DataBlockSize", "integer",
                   sizeof(size_t));
    RecalcMarshalStorageSize(Stream);
    MBase = Stream->M;
    MBase->BitFieldCount = 0;
    MBase->BitField = malloc(sizeof(size_t));
    MBase->DataBlockSize = 0;
}